

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O2

value_type __thiscall
djb::microfacet::sample(microfacet *this,vec2 *u,vec3 *wi,vec3 *wo_out,float_t *pdf,void *user_args)

{
  float fVar1;
  float fVar2;
  float fVar3;
  long lVar4;
  float *extraout_RDX;
  float *extraout_RDX_00;
  float *pfVar5;
  args *paVar6;
  microfacet *this_00;
  float_t fVar7;
  float_t fVar8;
  float_t fVar9;
  value_type vVar10;
  vec3 vVar11;
  vec3 vVar12;
  float_t *in_stack_00000008;
  float local_c8;
  float fStack_c4;
  vec3 local_b8;
  value_type F;
  vec3 local_98;
  args args;
  _Expr<std::__detail::_BinClos<std::__multiplies,_std::_ValArray,_std::_Constant,_float,_float>,_float>
  local_40;
  
  if (wo_out->z <= 0.0) {
    if (pdf != (float_t *)0x0) {
      pdf[0] = 0.0;
      pdf[1] = 0.0;
      pdf[2] = 0.0;
    }
    if (user_args != (void *)0x0) {
      *(undefined4 *)user_args = 0;
    }
    (**(code **)((long)*u + 0x10))(this,u);
    pfVar5 = extraout_RDX;
  }
  else {
    if (in_stack_00000008 == (float_t *)0x0) {
      microfacet::args::standard();
    }
    else {
      paVar6 = &args;
      for (lVar4 = 0x13; lVar4 != 0; lVar4 = lVar4 + -1) {
        (paVar6->mtra).r[0].x = *in_stack_00000008;
        in_stack_00000008 = in_stack_00000008 + 1;
        paVar6 = (args *)&(paVar6->mtra).r[0].y;
      }
    }
    this_00 = (microfacet *)u;
    vVar11 = u2_to_h2((microfacet *)u,(vec2 *)wi,wo_out,&args);
    local_98._0_8_ = vVar11._0_8_;
    local_98.z = vVar11.z;
    vVar12 = h2_to_s2(this_00,&local_98,wo_out);
    local_b8.z = vVar12.z;
    local_b8._0_8_ = vVar12._0_8_;
    local_c8 = vVar11.x;
    fStack_c4 = vVar11.y;
    fVar1 = wo_out->y;
    fVar2 = wo_out->x;
    fVar3 = wo_out->z;
    fVar7 = gcd((microfacet *)u,&local_98,wo_out,&local_b8,&args);
    (**(code **)(*(long *)u[1] + 0x20))(vVar11.z * fVar3 + fVar2 * local_c8 + fStack_c4 * fVar1,&F);
    if (pdf != (float_t *)0x0) {
      pdf[2] = local_b8.z;
      pdf[0] = local_b8.x;
      pdf[1] = local_b8.y;
    }
    if (user_args != (void *)0x0) {
      fVar8 = ndf((microfacet *)u,&local_98,&args);
      fVar9 = sigma((microfacet *)u,wo_out,&args);
      *(float *)user_args = fVar8 / (fVar9 * 4.0);
    }
    local_40._M_closure.super__BinBase2<std::__multiplies,_std::valarray<float>_>._M_expr1 = &F;
    local_40._M_closure.super__BinBase2<std::__multiplies,_std::valarray<float>_>._M_expr2 = fVar7;
    std::valarray<float>::
    valarray<std::__detail::_BinClos<std::__multiplies,std::_ValArray,std::_Constant,float,float>>
              ((valarray<float> *)this,&local_40);
    operator_delete(F._M_data);
    pfVar5 = extraout_RDX_00;
  }
  vVar10._M_data = pfVar5;
  vVar10._M_size = (size_t)this;
  return vVar10;
}

Assistant:

brdf::value_type
microfacet::sample(
	const vec2 &u,
	const vec3 &wi,
	vec3 *wo_out,
	float_t *pdf,
	const void *user_args
) const {
	if (wi.z > 0) {
		microfacet::args args =
			user_args ? *reinterpret_cast<const microfacet::args *>(user_args)
			          : microfacet::args::standard();
		vec3 wm = u2_to_h2(u, wi, args);
		vec3 wo = h2_to_s2(wm, wi);
		float_t zd = dot(wi, wm);
		float_t Gcd = gcd(wm, wi, wo, args);
		brdf::value_type F = m_fresnel->eval(zd);

		if (wo_out) (*wo_out) = wo;
		if (pdf) (*pdf) = ndf(wm, args) / (4 * sigma(wi, args));

		return F * Gcd;
	} else {
		if (wo_out) (*wo_out) = vec3(0);
		if (pdf) (*pdf) = 0;

		return zero_value();
	}
}